

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwhatsthis.cpp
# Opt level: O0

void __thiscall QWhatsThat::paintEvent(QWhatsThat *this,QPaintEvent *param_2)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Int IVar4;
  QBrush *pQVar5;
  long *plVar6;
  QWidget *in_RDI;
  long in_FS_OFFSET;
  PaintContext *this_00;
  int i;
  int h;
  int w;
  bool drawShadow;
  QRect rect;
  QPainter p;
  QRect r;
  PaintContext context;
  int in_stack_ffffffffffffff28;
  ColorRole in_stack_ffffffffffffff2c;
  QWidget *in_stack_ffffffffffffff30;
  int in_stack_ffffffffffffff38;
  int in_stack_ffffffffffffff3c;
  QRect *in_stack_ffffffffffffff40;
  int local_b0;
  QFlagsStorageHelper<Qt::AlignmentFlag,_4> local_8c;
  undefined8 local_88;
  undefined8 local_80;
  QPen local_78 [8];
  undefined1 *local_70;
  undefined1 local_68 [16];
  undefined1 local_58 [80];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = dropShadow();
  local_68._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_68 = (undefined1  [16])QWidget::rect(in_RDI);
  QRect::adjust(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30);
  if (bVar1) {
    QRect::adjust(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                  (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30);
  }
  local_70 = &DAT_aaaaaaaaaaaaaaaa;
  QPainter::QPainter((QPainter *)&local_70,&in_RDI->super_QPaintDevice);
  QWidget::palette(in_stack_ffffffffffffff30);
  pQVar5 = QPalette::toolTipText((QPalette *)0x4c3746);
  QPen::QPen(local_78,pQVar5,0.0,SolidLine,SquareCap,BevelJoin);
  QPainter::setPen((QPen *)&local_70);
  QPen::~QPen(local_78);
  QWidget::palette(in_stack_ffffffffffffff30);
  QPalette::toolTipBase((QPalette *)0x4c3791);
  QPainter::setBrush((QBrush *)&local_70);
  QPainter::drawRect((QPainter *)in_stack_ffffffffffffff30,
                     (QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  iVar2 = QRect::width((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  iVar3 = QRect::height((QRect *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  QWidget::palette(in_stack_ffffffffffffff30);
  QPalette::brush((QPalette *)in_stack_ffffffffffffff30,in_stack_ffffffffffffff2c);
  QBrush::color((QBrush *)0x4c37e8);
  QPainter::setPen((QColor *)&local_70);
  QPainter::drawRect((QPainter *)in_RDI,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                     (int)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                     in_stack_ffffffffffffff38);
  if (bVar1) {
    QWidget::palette(in_stack_ffffffffffffff30);
    QPalette::shadow((QPalette *)0x4c3833);
    QBrush::color((QBrush *)0x4c383b);
    QPainter::setPen((QColor *)&local_70);
    QPainter::drawPoint((QPainter *)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                        in_stack_ffffffffffffff38);
    QPainter::drawLine((QPainter *)in_RDI,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                       (int)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                       in_stack_ffffffffffffff38);
    QPainter::drawLine((QPainter *)in_RDI,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                       (int)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                       in_stack_ffffffffffffff38);
    for (local_b0 = 7; local_b0 < iVar3; local_b0 = local_b0 + 2) {
      QPainter::drawLine((QPainter *)in_RDI,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                         (int)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                         in_stack_ffffffffffffff38);
    }
    for (local_b0 = (iVar2 - local_b0) + iVar3; 6 < local_b0; local_b0 = local_b0 + -2) {
      QPainter::drawLine((QPainter *)in_RDI,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                         (int)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                         in_stack_ffffffffffffff38);
    }
    for (; 0 < local_b0; local_b0 = local_b0 + -2) {
      QPainter::drawLine((QPainter *)in_RDI,(int)((ulong)in_stack_ffffffffffffff40 >> 0x20),
                         (int)in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                         in_stack_ffffffffffffff38);
    }
  }
  QRect::adjust(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30);
  QWidget::palette(in_stack_ffffffffffffff30);
  QPalette::toolTipText((QPalette *)0x4c399e);
  QBrush::color((QBrush *)0x4c39a6);
  QPainter::setPen((QColor *)&local_70);
  QRect::adjust(in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38,
                (int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30);
  if (*(long *)&in_RDI[2].field_0x8 == 0) {
    local_8c.super_QFlagsStorage<Qt::AlignmentFlag>.i =
         (QFlagsStorage<Qt::AlignmentFlag>)
         Qt::operator|((enum_type)((ulong)in_stack_ffffffffffffff30 >> 0x20),
                       (enum_type)in_stack_ffffffffffffff30);
    IVar4 = ::QFlags::operator_cast_to_unsigned_int((QFlags *)&local_8c);
    QPainter::drawText((QRect *)&local_70,(int)local_68,(QString *)(ulong)(IVar4 | 0x1400),
                       (QRect *)&in_RDI[1].field_0x18);
  }
  else {
    iVar2 = QRect::x((QRect *)0x4c39ec);
    this_00 = (PaintContext *)(double)iVar2;
    QRect::y((QRect *)0x4c3a00);
    QPainter::translate((QPainter *)in_RDI,(qreal)in_stack_ffffffffffffff40,
                        (qreal)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38));
    local_88 = local_68._0_8_;
    local_80 = local_68._8_8_;
    QRect::x((QRect *)0x4c3a4a);
    QRect::y((QRect *)0x4c3a5e);
    QRect::translate((QRect *)this_00,in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28);
    QPainter::setClipRect((QRect *)&local_70,(ClipOperation)&local_88);
    memcpy(local_58,&DAT_00b0f640,0x50);
    QAbstractTextDocumentLayout::PaintContext::PaintContext(this_00);
    QPalette::toolTipText((QPalette *)0x4c3acc);
    QPalette::setBrush((QPalette *)this_00,in_stack_ffffffffffffff2c,(QBrush *)0x4c3ade);
    plVar6 = (long *)QTextDocument::documentLayout();
    (**(code **)(*plVar6 + 0x60))(plVar6,&local_70,local_58);
    QAbstractTextDocumentLayout::PaintContext::~PaintContext(this_00);
  }
  QPainter::~QPainter((QPainter *)&local_70);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QWhatsThat::paintEvent(QPaintEvent*)
{
    const bool drawShadow = dropShadow();

    QRect r = rect();
    r.adjust(0, 0, -1, -1);
    if (drawShadow)
        r.adjust(0, 0, -shadowWidth, -shadowWidth);
    QPainter p(this);
    p.setPen(QPen(palette().toolTipText(), 0));
    p.setBrush(palette().toolTipBase());
    p.drawRect(r);
    int w = r.width();
    int h = r.height();
    p.setPen(palette().brush(QPalette::Dark).color());
    p.drawRect(1, 1, w-2, h-2);
    if (drawShadow) {
        p.setPen(palette().shadow().color());
        p.drawPoint(w + 5, 6);
        p.drawLine(w + 3, 6, w + 5, 8);
        p.drawLine(w + 1, 6, w + 5, 10);
        int i;
        for(i=7; i < h; i += 2)
            p.drawLine(w, i, w + 5, i + 5);
        for(i = w - i + h; i > 6; i -= 2)
            p.drawLine(i, h, i + 5, h + 5);
        for(; i > 0 ; i -= 2)
            p.drawLine(6, h + 6 - i, i + 5, h + 5);
    }
    r.adjust(0, 0, 1, 1);
    p.setPen(palette().toolTipText().color());
    r.adjust(hMargin, vMargin, -hMargin, -vMargin);

    if (doc) {
        p.translate(r.x(), r.y());
        QRect rect = r;
        rect.translate(-r.x(), -r.y());
        p.setClipRect(rect);
        QAbstractTextDocumentLayout::PaintContext context;
        context.palette.setBrush(QPalette::Text, context.palette.toolTipText());
        doc->documentLayout()->draw(&p, context);
    }
    else
    {
        p.drawText(r, Qt::AlignLeft | Qt::AlignTop | Qt::TextWordWrap | Qt::TextExpandTabs, text);
    }
}